

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  SPIRType *pSVar5;
  char *pcVar6;
  SPIRVariable *pSVar7;
  CompilerError *pCVar8;
  uint32_t i;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  char (*ts_2_00) [2];
  char (*in_R9) [2];
  char (*in_stack_ffffffffffffff48) [2];
  string type_address_space;
  string type_name;
  string local_70;
  spirv_cross local_50 [32];
  
  paVar1 = &type_name.field_2;
  type_name._M_string_length = 0;
  type_name.field_2._M_local_buf[0] = '\0';
  type_name._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = Compiler::type_is_top_level_pointer((Compiler *)this,type);
  if ((bVar3) || (bVar3 = Compiler::type_is_array_of_pointers((Compiler *)this,type), bVar3)) {
    if (type->pointer_depth == 0) {
      __assert_fail("type.pointer_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x3911,
                    "string spirv_cross::CompilerMSL::type_to_glsl(const SPIRType &, uint32_t, bool)"
                   );
    }
    ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    get_type_address_space_abi_cxx11_(&type_address_space,this,type,id,false);
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    bVar3 = type_is_pointer_to_pointer(this,type);
    if (bVar3) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_50,this,pSVar5,(ulong)id);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_70,local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39ece0,
                 (char (*) [2])&type_address_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39ece0,in_R9
                );
      ::std::__cxx11::string::operator=((string *)&type_name,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)local_50);
    }
    else {
      while (bVar3 = type_is_pointer(this,pSVar5), bVar3) {
        pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar5->parent_type).id);
      }
      bVar3 = this->is_using_builtin_array;
      bVar4 = Compiler::type_is_top_level_physical_pointer((Compiler *)this,type);
      if (bVar4) {
        this->is_using_builtin_array = false;
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_50,this,pSVar5,(ulong)id);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                (&local_70,(spirv_cross *)&type_address_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39ece0,
                 (char (*) [2])local_50,ts_2);
      ::std::__cxx11::string::operator=((string *)&type_name,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)local_50);
      this->is_using_builtin_array = bVar3;
    }
    if (2 < *(int *)&(type->super_IVariant).field_0xc - 0x10U) {
      ::std::__cxx11::string::append((char *)&type_name);
      pcVar6 = to_restrict(this,id,false);
      if (*pcVar6 != '\0') {
        ::std::__cxx11::string::append((char *)&type_name);
        ::std::__cxx11::string::append((char *)&type_name);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type_name._M_dataplus._M_p == &type_name.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,type_name.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = type_name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = type_name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,type_name.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = type_name._M_string_length;
    type_name._M_string_length = 0;
    type_name.field_2._M_local_buf[0] = '\0';
    type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
    goto LAB_0031c335;
  }
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 1:
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"void",(allocator *)&type_address_space);
    goto LAB_0031c33f;
  case 2:
    pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
    if ((pSVar7 != (SPIRVariable *)0x0) && (uVar2 = (pSVar7->basevariable).id, uVar2 != 0)) {
      Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
    }
    ::std::__cxx11::string::assign((char *)&type_name);
    goto LAB_0031c622;
  case 3:
  case 0x17:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  case 7:
    break;
  case 8:
    break;
  case 9:
    if ((this->msl_options).msl_version < 0x4ee8) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_address_space,
                 "64-bit integers are only supported in MSL 2.2 and above.",(allocator *)&local_70);
      CompilerError::CompilerError(pCVar8,&type_address_space);
      __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 10:
    if ((this->msl_options).msl_version < 0x4ee8) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_address_space,
                 "64-bit integers are only supported in MSL 2.2 and above.",(allocator *)&local_70);
      CompilerError::CompilerError(pCVar8,&type_address_space);
      __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0xb:
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"atomic_uint",(allocator *)&type_address_space);
    goto LAB_0031c33f;
  case 0xc:
    break;
  case 0xd:
    break;
  case 0xe:
    break;
  case 0xf:
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&type_address_space,this,(ulong)(type->super_IVariant).self.id,1);
    ::std::__cxx11::string::operator=((string *)&type_name,(string *)&type_address_space);
    ::std::__cxx11::string::~string((string *)&type_address_space);
    goto LAB_0031c622;
  case 0x10:
  case 0x11:
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
              (__return_storage_ptr__,this,type,(ulong)id);
    goto LAB_0031c33f;
  case 0x12:
    sampler_type_abi_cxx11_(__return_storage_ptr__,this,type,id);
    goto LAB_0031c33f;
  case 0x13:
    uVar9 = (this->msl_options).msl_version;
    if ((uVar9 < 0x4fb0) && (uVar9 < 0x4f4c)) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_address_space,
                 "Acceleration Structure Type is supported in MSL 2.3 and above.",
                 (allocator *)&local_70);
      CompilerError::CompilerError(pCVar8,&type_address_space);
      __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x14:
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>",
               (allocator *)&type_address_space);
    goto LAB_0031c33f;
  case 0x15:
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    ts_2_00 = (char (*) [2])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(_func_int **)(ts_2_00 + 0x4c))(&type_address_space,this,pSVar5,(ulong)id);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"patch_control_point<",
               (char (*) [21])&type_address_space,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4d05,ts_2_00
              );
    goto LAB_0031c335;
  case 0x16:
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&type_address_space,this,pSVar5,(ulong)id);
    bVar3 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationNoPerspective);
    pcVar6 = "centroid_perspective";
    if (bVar3) {
      pcVar6 = "centroid_no_perspective";
    }
    local_70._M_dataplus._M_p = pcVar6 + 9;
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[18],char_const*,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"interpolant<",
               (char (*) [13])&type_address_space,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ", interpolation::",(char (*) [18])&local_70,(char **)0x3a4d05,
               in_stack_ffffffffffffff48);
    goto LAB_0031c335;
  default:
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"unknown_type",(allocator *)&type_address_space);
    goto LAB_0031c33f;
  }
  ::std::__cxx11::string::assign((char *)&type_name);
LAB_0031c622:
  if (1 < type->columns) {
    pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
    if (pSVar7 == (SPIRVariable *)0x0) {
LAB_0031c651:
      if (type->storage == StorageClassWorkgroup) goto LAB_0031c65b;
    }
    else {
      uVar2 = (pSVar7->basevariable).id;
      if (uVar2 != 0) {
        pSVar7 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
      }
      if (pSVar7->storage != StorageClassWorkgroup) goto LAB_0031c651;
LAB_0031c65b:
      if ((this->msl_options).msl_version < 30000) {
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        ::std::operator+(&type_address_space,"spvStorage_",&type_name);
        ::std::__cxx11::string::operator=((string *)&type_name,(string *)&type_address_space);
        ::std::__cxx11::string::~string((string *)&type_address_space);
      }
    }
    ::std::__cxx11::to_string(&local_70,type->columns);
    ::std::operator+(&type_address_space,&local_70,"x");
    ::std::__cxx11::string::append((string *)&type_name);
    ::std::__cxx11::string::~string((string *)&type_address_space);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  if (1 < type->vecsize) {
    ::std::__cxx11::to_string(&type_address_space,type->vecsize);
    ::std::__cxx11::string::append((string *)&type_name);
    ::std::__cxx11::string::~string((string *)&type_address_space);
  }
  if ((((type->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
      ((this->msl_options).force_native_arrays != false)) ||
     ((this->is_using_builtin_array & 1U) != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type_name._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,type_name.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = type_name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = type_name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,type_name.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = type_name._M_string_length;
    type_name._M_string_length = 0;
    type_name.field_2._M_local_buf[0] = '\0';
    type_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    add_spv_func_and_recompile(this,SPVFuncImplUnsafeArray);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    type_address_space._M_dataplus._M_p = (pointer)&type_address_space.field_2;
    type_address_space._M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    type_address_space.field_2._M_local_buf[0] = '\0';
    for (uVar9 = 0; uVar9 < (uint)(type->array).super_VectorView<unsigned_int>.buffer_size;
        uVar9 = uVar9 + 1) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)&type_address_space);
      CompilerGLSL::to_array_size_abi_cxx11_(&local_70,&this->super_CompilerGLSL,type,uVar9);
      ::std::__cxx11::string::append((string *)&type_address_space);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::append((char *)&type_address_space);
    }
    ::std::operator+(&local_70,&type_name,&type_address_space);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
LAB_0031c335:
    ::std::__cxx11::string::~string((string *)&type_address_space);
  }
LAB_0031c33f:
  ::std::__cxx11::string::~string((string *)&type_name);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_glsl(const SPIRType &type, uint32_t id, bool member)
{
	string type_name;

	// Pointer?
	if (type_is_top_level_pointer(type) || type_is_array_of_pointers(type))
	{
		assert(type.pointer_depth > 0);

		const char *restrict_kw;

		auto type_address_space = get_type_address_space(type, id);
		const auto *p_parent_type = &get<SPIRType>(type.parent_type);

		// Work around C pointer qualifier rules. If glsl_type is a pointer type as well
		// we'll need to emit the address space to the right.
		// We could always go this route, but it makes the code unnatural.
		// Prefer emitting thread T *foo over T thread* foo since it's more readable,
		// but we'll have to emit thread T * thread * T constant bar; for example.
		if (type_is_pointer_to_pointer(type))
			type_name = join(type_to_glsl(*p_parent_type, id), " ", type_address_space, " ");
		else
		{
			// Since this is not a pointer-to-pointer, ensure we've dug down to the base type.
			// Some situations chain pointers even though they are not formally pointers-of-pointers.
			while (type_is_pointer(*p_parent_type))
				p_parent_type = &get<SPIRType>(p_parent_type->parent_type);

			// If we're emitting BDA, just use the templated type.
			// Emitting builtin arrays need a lot of cooperation with other code to ensure
			// the C-style nesting works right.
			// FIXME: This is somewhat of a hack.
			bool old_is_using_builtin_array = is_using_builtin_array;
			if (type_is_top_level_physical_pointer(type))
				is_using_builtin_array = false;

			type_name = join(type_address_space, " ", type_to_glsl(*p_parent_type, id));

			is_using_builtin_array = old_is_using_builtin_array;
		}

		switch (type.basetype)
		{
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::Sampler:
			// These are handles.
			break;
		default:
			// Anything else can be a raw pointer.
			type_name += "*";
			restrict_kw = to_restrict(id, false);
			if (*restrict_kw)
			{
				type_name += " ";
				type_name += restrict_kw;
			}
			break;
		}
		return type_name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		// Allow Metal to use the array<T> template to make arrays a value type
		type_name = to_name(type.self);
		break;

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		return sampler_type(type, id);

	case SPIRType::Void:
		return "void";

	case SPIRType::AtomicCounter:
		return "atomic_uint";

	case SPIRType::ControlPointArray:
		return join("patch_control_point<", type_to_glsl(get<SPIRType>(type.parent_type), id), ">");

	case SPIRType::Interpolant:
		return join("interpolant<", type_to_glsl(get<SPIRType>(type.parent_type), id), ", interpolation::",
		            has_decoration(type.self, DecorationNoPerspective) ? "no_perspective" : "perspective", ">");

	// Scalars
	case SPIRType::Boolean:
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup booleans. They are supposed to be logical
		// storage, but MSL compilers will sometimes crash if you use threadgroup bool.
		// Workaround this by using 16-bit types instead and fixup on load-store to this data.
		if ((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup || member)
			type_name = "short";
		else
			type_name = "bool";
		break;
	}

	case SPIRType::Char:
	case SPIRType::SByte:
		type_name = "char";
		break;
	case SPIRType::UByte:
		type_name = "uchar";
		break;
	case SPIRType::Short:
		type_name = "short";
		break;
	case SPIRType::UShort:
		type_name = "ushort";
		break;
	case SPIRType::Int:
		type_name = "int";
		break;
	case SPIRType::UInt:
		type_name = "uint";
		break;
	case SPIRType::Int64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "long";
		break;
	case SPIRType::UInt64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "ulong";
		break;
	case SPIRType::Half:
		type_name = "half";
		break;
	case SPIRType::Float:
		type_name = "float";
		break;
	case SPIRType::Double:
		type_name = "double"; // Currently unsupported
		break;
	case SPIRType::AccelerationStructure:
		if (msl_options.supports_msl_version(2, 4))
			type_name = "raytracing::acceleration_structure<raytracing::instancing>";
		else if (msl_options.supports_msl_version(2, 3))
			type_name = "raytracing::instance_acceleration_structure";
		else
			SPIRV_CROSS_THROW("Acceleration Structure Type is supported in MSL 2.3 and above.");
		break;
	case SPIRType::RayQuery:
		return "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>";

	default:
		return "unknown_type";
	}

	// Matrix?
	if (type.columns > 1)
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup matrices. Due to an oversight, Metal's
		// matrix struct prior to Metal 3 lacks constructors in the threadgroup AS,
		// preventing us from default-constructing or initializing matrices in threadgroup storage.
		// Work around this by using our own type as storage.
		if (((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup) &&
		    !msl_options.supports_msl_version(3, 0))
		{
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			type_name = "spvStorage_" + type_name;
		}

		type_name += to_string(type.columns) + "x";
	}

	// Vector or Matrix?
	if (type.vecsize > 1)
		type_name += to_string(type.vecsize);

	if (type.array.empty() || using_builtin_array())
	{
		return type_name;
	}
	else
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		add_spv_func_and_recompile(SPVFuncImplUnsafeArray);
		string res;
		string sizes;

		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			res += "spvUnsafeArray<";
			sizes += ", ";
			sizes += to_array_size(type, i);
			sizes += ">";
		}

		res += type_name + sizes;
		return res;
	}
}